

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress2(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  ZSTD_CCtx *code;
  size_t err_code;
  size_t result;
  size_t iPos;
  size_t oPos;
  ZSTD_bufferMode_e originalOutBufferMode;
  ZSTD_bufferMode_e originalInBufferMode;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  oPos._4_4_ = (cctx->requestedParams).inBufferMode;
  oPos._0_4_ = (cctx->requestedParams).outBufferMode;
  _originalOutBufferMode = srcSize;
  srcSize_local = (size_t)src;
  src_local = (void *)dstCapacity;
  dstCapacity_local = (size_t)dst;
  dst_local = cctx;
  ZSTD_CCtx_reset(cctx,ZSTD_reset_session_only);
  *(undefined4 *)((long)dst_local + 0x8c) = 1;
  *(undefined4 *)((long)dst_local + 0x90) = 1;
  iPos = 0;
  result = 0;
  code = (ZSTD_CCtx *)
         ZSTD_compressStream2_simpleArgs
                   ((ZSTD_CCtx *)dst_local,(void *)dstCapacity_local,(size_t)src_local,&iPos,
                    (void *)srcSize_local,_originalOutBufferMode,&result,ZSTD_e_end);
  *(ZSTD_bufferMode_e *)((long)dst_local + 0x8c) = oPos._4_4_;
  *(ZSTD_bufferMode_e *)((long)dst_local + 0x90) = (ZSTD_bufferMode_e)oPos;
  uVar1 = ERR_isError((size_t)code);
  cctx_local = code;
  if (uVar1 == 0) {
    if (code == (ZSTD_CCtx *)0x0) {
      cctx_local = (ZSTD_CCtx *)iPos;
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffba;
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compress2(ZSTD_CCtx* cctx,
                      void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    ZSTD_bufferMode_e const originalInBufferMode = cctx->requestedParams.inBufferMode;
    ZSTD_bufferMode_e const originalOutBufferMode = cctx->requestedParams.outBufferMode;
    DEBUGLOG(4, "ZSTD_compress2 (srcSize=%u)", (unsigned)srcSize);
    ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
    /* Enable stable input/output buffers. */
    cctx->requestedParams.inBufferMode = ZSTD_bm_stable;
    cctx->requestedParams.outBufferMode = ZSTD_bm_stable;
    {   size_t oPos = 0;
        size_t iPos = 0;
        size_t const result = ZSTD_compressStream2_simpleArgs(cctx,
                                        dst, dstCapacity, &oPos,
                                        src, srcSize, &iPos,
                                        ZSTD_e_end);
        /* Reset to the original values. */
        cctx->requestedParams.inBufferMode = originalInBufferMode;
        cctx->requestedParams.outBufferMode = originalOutBufferMode;
        FORWARD_IF_ERROR(result, "ZSTD_compressStream2_simpleArgs failed");
        if (result != 0) {  /* compression not completed, due to lack of output space */
            assert(oPos == dstCapacity);
            RETURN_ERROR(dstSize_tooSmall, "");
        }
        assert(iPos == srcSize);   /* all input is expected consumed */
        return oPos;
    }
}